

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_mod.c
# Opt level: O0

void zzHalfMod(word *b,word *a,word *mod,size_t n)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  size_t i;
  word w;
  word mask;
  word carry;
  size_t n_local;
  word *mod_local;
  word *a_local;
  word *b_local;
  
  uVar1 = *a;
  uVar2 = -(uVar1 & 1) & *mod;
  *b = *a + uVar2;
  bVar4 = *b < uVar2;
  *b = *b >> 1;
  for (i = 1; carry = (word)(int)(uint)bVar4, i < n; i = i + 1) {
    b[i] = a[i];
    b[i] = carry + b[i];
    uVar2 = b[i];
    uVar3 = -(uVar1 & 1) & mod[i];
    b[i] = uVar3 + b[i];
    bVar4 = b[i] < uVar3 || uVar2 < carry;
    b[i - 1] = b[i] << 0x3f | b[i - 1];
    b[i] = b[i] >> 1;
  }
  b[n - 1] = carry << 0x3f | b[n - 1];
  return;
}

Assistant:

void SAFE(zzHalfMod)(word b[], const word a[], const word mod[], size_t n)
{
	register word carry = 0;
	register word mask = 0;
	register word w;
	size_t i;
	// pre
	ASSERT(wwIsSameOrDisjoint(a, b, n));
	ASSERT(wwIsDisjoint(mod, b, n));
	ASSERT(zzIsOdd(mod, n) && mod[n - 1] != 0);
	ASSERT(wwCmp(a, mod, n) < 0);
	// mask <- (a -- нечетное) ? WORD_MAX : WORD_0
	mask = WORD_0 - (a[0] & WORD_1);
	// b <- (a + mod & mask) / 2 [(a -- нечетное) ? (a + mod) / 2 : a / 2]
	w = mask & mod[0];
	b[0] = a[0] + w;
	carry = wordLess01(b[0], w);
	b[0] >>= 1;
	for(i = 1; i < n; ++i)
	{
		b[i] = a[i];
		b[i] += carry;
		carry = wordLess01(b[i], carry);
		w = mask & mod[i];
		b[i] += w;
		carry |= wordLess01(b[i], w);
		b[i - 1] |= (b[i] & WORD_1) << (B_PER_W - 1);
		b[i] >>= 1;
	}
	b[n - 1] |= carry << (B_PER_W - 1);
	// очистка
	carry = mask = w = 0;
}